

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O0

size_t ascon_aead128a_decrypt_update
                 (ascon_aead_ctx_t *ctx,uint8_t *plaintext,uint8_t *ciphertext,size_t ciphertext_len
                 )

{
  size_t sVar1;
  ascon_aead_ctx_t *in_RCX;
  undefined8 in_RDX;
  size_t in_RSI;
  absorb_fptr in_RDI;
  uint8_t *unaff_retaddr;
  uint8_t rate;
  
  rate = (uint8_t)((ulong)in_RDX >> 0x38);
  if (in_RDI[0x39] != (_func_void_ascon_sponge_t_ptr_uint8_t_ptr_uint8_t_ptr)0xa) {
    ascon_128a_finalise_assoc_data(in_RCX);
  }
  in_RDI[0x39] = (code)0xa;
  sVar1 = buffered_accumulation
                    ((ascon_bufstate_t *)ciphertext,(uint8_t *)ciphertext_len,unaff_retaddr,in_RDI,
                     in_RSI,rate);
  return sVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128a_decrypt_update(ascon_aead_ctx_t* const ctx,
                              uint8_t* plaintext,
                              const uint8_t* ciphertext,
                              size_t ciphertext_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(ciphertext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(ciphertext_len == 0 || plaintext != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_DECRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128a_DECRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_128a_finalise_assoc_data(ctx);
    }
    ctx->bufstate.flow_state = ASCON_FLOW_AEAD128a_DECRYPT_UPDATED;
    // Start absorbing ciphertext and simultaneously squeezing out plaintext
    return buffered_accumulation(&ctx->bufstate, plaintext, ciphertext,
                                 absorb_ciphertext, ciphertext_len,
                                 ASCON_DOUBLE_RATE);
}